

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O2

bool __thiscall xmrig::Url::parseIPv6(Url *this,char *addr)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  ulong __n;
  
  pcVar1 = strchr(addr,0x5d);
  if ((pcVar1 != (char *)0x0) && (pcVar2 = strchr(pcVar1,0x3a), pcVar2 != (char *)0x0)) {
    __n = (long)pcVar1 - (long)addr;
    pcVar1 = (char *)operator_new__(__n);
    memset(pcVar1,0,__n);
    memcpy(pcVar1,addr + 1,__n - 1);
    String::move(&this->m_host,pcVar1);
    lVar3 = strtol(pcVar2 + 1,(char **)0x0,10);
    this->m_port = (uint16_t)lVar3;
    return true;
  }
  return false;
}

Assistant:

bool xmrig::Url::parseIPv6(const char *addr)
{
    const char *end = strchr(addr, ']');
    if (!end) {
        return false;
    }

    const char *port = strchr(end, ':');
    if (!port) {
        return false;
    }

    const auto size = static_cast<size_t>(end - addr);
    char *host        = new char[size]();
    memcpy(host, addr + 1, size - 1);

    m_host = host;
    m_port = static_cast<uint16_t>(strtol(port + 1, nullptr, 10));

    return true;
}